

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void __thiscall
fill<128U,_104U,_buffer_layout_bfs>::operator()
          (fill<128U,_104U,_buffer_layout_bfs> *this,array<Stream,_128UL> *streams,uchar **buffer,
          array<unsigned_long,_128UL> *buffer_count)

{
  ulong uVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uchar **ppuVar8;
  uchar **ppuVar9;
  ulong uVar10;
  ulong uVar11;
  uchar **local_80;
  uchar **local_78;
  size_t local_70;
  DI local_38;
  
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"fill_leaf");
  poVar3 = std::operator<<(poVar3,", leaf,  I=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  local_38.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  if (buffer_count->_M_elems[0x68] != 0) {
    __assert_fail("buffer_count[I] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                  ,0x13b,
                  "void fill_leaf(std::array<Stream, K> &__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict, std::true_type) [K = 128U, I = 104U, BufferLayout = buffer_layout_bfs]"
                 );
  }
  local_70 = streams->_M_elems[0x50].n;
  uVar10 = streams->_M_elems[0x51].n;
  uVar1 = uVar10 + local_70;
  if (uVar1 < 0x17) {
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"need=");
    local_80 = (uchar **)0x17;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", Ln=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", Rn=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"\n");
    if (local_70 != 0) {
      if (uVar10 == 0) {
        local_78 = (uchar **)0x17;
LAB_00178702:
        poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        poVar3 = std::operator<<(poVar3,"right drained, Ln=");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,", Rn=");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3,"\n");
        memcpy(buffer + -uVar1 + 0x614f + (0x17 - (long)local_78),streams->_M_elems[0x50].stream,
               local_70 << 3);
        streams->_M_elems[0x50].n = 0;
        buffer_count->_M_elems[0x68] = uVar1;
        check_input(buffer + -uVar1 + 0x614f,uVar1);
        goto LAB_0017888d;
      }
      local_80 = streams->_M_elems[0x50].stream;
      lVar7 = 0x17;
      ppuVar8 = streams->_M_elems[0x51].stream;
      do {
        uVar5 = uVar10;
        lVar4 = lVar7;
        lVar7 = -1;
        uVar6 = 0;
        ppuVar9 = ppuVar8;
        while (iVar2 = cmp(*local_80,ppuVar8[uVar6]), 0 < iVar2) {
          buffer[((uVar6 + 0x6166) - lVar4) - uVar1] = ppuVar8[uVar6];
          ppuVar9 = ppuVar9 + 1;
          streams->_M_elems[0x51].stream = ppuVar9;
          streams->_M_elems[0x51].n = uVar5 + lVar7;
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + -1;
          if (uVar5 == uVar6) {
            local_78 = (uchar **)(lVar4 - uVar6);
            goto LAB_00178702;
          }
        }
        buffer[((uVar6 + 0x6166) - lVar4) - uVar1] = *local_80;
        local_80 = local_80 + 1;
        streams->_M_elems[0x50].stream = local_80;
        local_70 = local_70 - 1;
        streams->_M_elems[0x50].n = local_70;
        lVar7 = ~uVar6 + lVar4;
        uVar10 = uVar5 - uVar6;
        ppuVar8 = ppuVar9;
      } while (local_70 != 0);
      uVar10 = uVar5 - uVar6;
      local_80 = (uchar **)(~uVar6 + lVar4);
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"left drained, Ln=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", Rn=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"\n");
    if (uVar10 != 0) {
      memcpy(buffer + -uVar1 + (0x6166 - (long)local_80),streams->_M_elems[0x51].stream,uVar10 << 3)
      ;
    }
    streams->_M_elems[0x51].n = 0;
    buffer_count->_M_elems[0x68] = uVar1;
    goto LAB_0017888d;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"need=");
  lVar7 = 0x17;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", Ln=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", Rn=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  if (local_70 == 0) {
LAB_0017863b:
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"left drained, Ln=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", Rn=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"\n");
    ppuVar8 = streams->_M_elems[0x51].stream;
    if (lVar7 != 0) {
      memcpy(buffer + (0x614f - lVar7),ppuVar8,lVar7 * 8);
    }
    streams->_M_elems[0x51].n = uVar10 - lVar7;
    streams->_M_elems[0x51].stream = ppuVar8 + lVar7;
  }
  else {
    if (uVar10 != 0) {
      local_78 = streams->_M_elems[0x50].stream;
      uVar1 = 0x17;
      ppuVar8 = streams->_M_elems[0x51].stream;
      do {
        uVar6 = uVar10;
        uVar5 = uVar1;
        uVar11 = 0;
        lVar7 = -1;
        ppuVar9 = ppuVar8;
        while( true ) {
          if (uVar5 == uVar11) goto LAB_0017887a;
          iVar2 = cmp(*local_78,ppuVar8[uVar11]);
          if (iVar2 < 1) break;
          buffer[(uVar11 + 0x614f) - uVar5] = ppuVar8[uVar11];
          ppuVar9 = ppuVar9 + 1;
          streams->_M_elems[0x51].stream = ppuVar9;
          streams->_M_elems[0x51].n = lVar7 + uVar6;
          uVar11 = uVar11 + 1;
          lVar7 = lVar7 + -1;
          if (uVar6 == uVar11) {
            lVar7 = uVar5 - uVar11;
            goto LAB_001787e0;
          }
        }
        buffer[(uVar11 + 0x614f) - uVar5] = *local_78;
        local_78 = local_78 + 1;
        streams->_M_elems[0x50].stream = local_78;
        local_70 = local_70 - 1;
        streams->_M_elems[0x50].n = local_70;
        uVar1 = ~uVar11 + uVar5;
        uVar10 = uVar6 - uVar11;
        ppuVar8 = ppuVar9;
      } while (local_70 != 0);
      uVar10 = uVar6 - uVar11;
      lVar7 = ~uVar11 + uVar5;
      goto LAB_0017863b;
    }
    lVar7 = 0x17;
LAB_001787e0:
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"right drained, Ln=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", Rn=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"\n");
    ppuVar8 = streams->_M_elems[0x50].stream;
    if (lVar7 != 0) {
      memcpy(buffer + (0x614f - lVar7),ppuVar8,lVar7 * 8);
    }
    streams->_M_elems[0x50].n = local_70 - lVar7;
    streams->_M_elems[0x50].stream = ppuVar8 + lVar7;
  }
LAB_0017887a:
  buffer_count->_M_elems[0x68] = 0x17;
  check_input(buffer + 0x6138,0x17);
LAB_0017888d:
  anon_func::DI::~DI(&local_38);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}